

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

void __thiscall google::protobuf::UnknownFieldSet::ClearAndFreeMemory(UnknownFieldSet *this)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  pointer pUVar2;
  
  if (this->fields_ !=
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    ClearFallback(this);
    pvVar1 = this->fields_;
    if (pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      pUVar2 = (pvVar1->
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pUVar2 != (pointer)0x0) {
        operator_delete(pUVar2,(long)(pvVar1->
                                     super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pUVar2);
      }
      operator_delete(pvVar1,0x18);
    }
    this->fields_ =
         (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
         0x0;
  }
  return;
}

Assistant:

void UnknownFieldSet::ClearAndFreeMemory() {
  if (fields_ != NULL) {
    Clear();
    delete fields_;
    fields_ = NULL;
  }
}